

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

void __thiscall bssl::Vector<NotDefaultConstructible>::clear(Vector<NotDefaultConstructible> *this)

{
  Array<int> *this_00;
  size_t sVar1;
  bool bVar2;
  
  this_00 = &this->data_->array;
  sVar1 = this->size_;
  while (bVar2 = sVar1 != 0, sVar1 = sVar1 - 1, bVar2) {
    Array<int>::~Array(this_00);
    this_00 = this_00 + 1;
  }
  OPENSSL_free(this->data_);
  this->data_ = (NotDefaultConstructible *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void clear() {
    std::destroy_n(data_, size_);
    OPENSSL_free(data_);
    data_ = nullptr;
    size_ = 0;
    capacity_ = 0;
  }